

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall Fossilize::StreamArchive::resolve_path(StreamArchive *this,string *read_only_part)

{
  undefined8 base;
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string local_70;
  string local_50;
  undefined8 local_30;
  size_t offset;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cmpstr [11];
  string *read_only_part_local;
  StreamArchive *this_local;
  
  offset._5_1_ = '$';
  offset._6_1_ = 'b';
  offset._7_1_ = 'u';
  cStack_20 = 'c';
  cStack_1f = 'k';
  cStack_1e = 'e';
  cStack_1d = 't';
  cStack_1c = 'd';
  cmpstr[0] = 'i';
  cmpstr[1] = 'r';
  cmpstr[2] = '\0';
  local_30 = 10;
  cmpstr._3_8_ = read_only_part;
  iVar1 = std::__cxx11::string::compare((ulong)&this->path,0,(char *)0xa);
  if ((iVar1 == 0) && (uVar2 = std::__cxx11::string::size(), 10 < uVar2)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->path);
    if ((*pcVar3 != '/') &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->path), *pcVar3 != '\\')) {
      return;
    }
    base = cmpstr._3_8_;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&this->path);
    Path::relpath(&local_50,(string *)base,&local_70);
    std::__cxx11::string::operator=((string *)&this->path,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void resolve_path(const std::string &read_only_part)
	{
		constexpr char cmpstr[] = "$bucketdir";
		constexpr size_t offset = sizeof(cmpstr) - 1;
		if (path.compare(0, offset, cmpstr) == 0 &&
		    path.size() > offset &&
		    (path[offset] == '/' || path[offset] == '\\'))
		{
			path = Path::relpath(read_only_part, path.substr(offset + 1));
		}
	}